

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_string_format.cpp
# Opt level: O0

wchar_t * ConvertToCLangFormat(wchar_t *format,ON_wStringBuffer *clang_format_buffer)

{
  wchar_t wVar1;
  bool bVar2;
  wchar_t *pwVar3;
  wchar_t *pwVar4;
  wchar_t *pwVar5;
  wchar_t *local_40;
  wchar_t *ls;
  wchar_t *pwStack_30;
  wchar_t c;
  wchar_t *s;
  size_t format_capacity;
  ON_wStringBuffer *clang_format_buffer_local;
  wchar_t *format_local;
  
  s = (wchar_t *)0x0;
  pwStack_30 = format;
  do {
    pwVar3 = pwStack_30;
    if (*pwStack_30 == L'%') {
      pwVar3 = pwStack_30 + 1;
      wVar1 = *pwVar3;
      if (wVar1 == L's') {
        s = (wchar_t *)((long)s + 1);
        pwVar3 = pwStack_30 + 2;
      }
      else if ((L'0' < wVar1) && (wVar1 < L':')) {
        pwStack_30 = pwStack_30 + 2;
        while( true ) {
          bVar2 = false;
          if (L'/' < *pwStack_30) {
            bVar2 = *pwStack_30 < L':';
          }
          if (!bVar2) break;
          pwStack_30 = pwStack_30 + 1;
        }
        pwVar3 = pwStack_30;
        if ((*pwStack_30 == L'$') && (pwStack_30[1] == L's')) {
          s = (wchar_t *)((long)s + 1);
          pwVar3 = pwStack_30 + 2;
        }
      }
    }
    pwStack_30 = pwVar3;
    pwVar3 = pwStack_30 + 1;
    wVar1 = *pwStack_30;
    pwStack_30 = pwVar3;
  } while (wVar1 != L'\0');
  format_local = format;
  if (((s != (wchar_t *)0x0) &&
      (bVar2 = ON_wStringBuffer::GrowBuffer
                         (clang_format_buffer,((long)pwVar3 - (long)format >> 2) + 1 + (long)s),
      bVar2)) &&
     (pwVar3 = clang_format_buffer->m_buffer, local_40 = pwVar3, pwStack_30 = format,
     pwVar3 != (wchar_t *)0x0)) {
    do {
      pwVar5 = local_40;
      pwVar4 = pwStack_30;
      if (*pwStack_30 == L'%') {
        pwVar4 = pwStack_30 + 1;
        pwVar5 = local_40 + 1;
        *local_40 = *pwStack_30;
        wVar1 = *pwVar4;
        if (wVar1 == L's') {
          *pwVar5 = L'l';
          local_40[2] = *pwVar4;
          pwVar5 = local_40 + 3;
          pwVar4 = pwStack_30 + 2;
        }
        else if ((L'0' < wVar1) && (wVar1 < L':')) {
          *pwVar5 = *pwVar4;
          local_40 = local_40 + 2;
          pwStack_30 = pwStack_30 + 2;
          while( true ) {
            bVar2 = false;
            if (L'/' < *pwStack_30) {
              bVar2 = *pwStack_30 < L':';
            }
            if (!bVar2) break;
            *local_40 = *pwStack_30;
            local_40 = local_40 + 1;
            pwStack_30 = pwStack_30 + 1;
          }
          pwVar5 = local_40;
          pwVar4 = pwStack_30;
          if ((*pwStack_30 == L'$') && (pwStack_30[1] == L's')) {
            *local_40 = *pwStack_30;
            local_40[1] = L'l';
            local_40[2] = pwStack_30[1];
            pwVar5 = local_40 + 3;
            pwVar4 = pwStack_30 + 2;
          }
        }
      }
      pwStack_30 = pwVar4;
      local_40 = pwVar5;
      wVar1 = *pwStack_30;
      *local_40 = wVar1;
      local_40 = local_40 + 1;
      pwStack_30 = pwStack_30 + 1;
      format_local = pwVar3;
    } while (wVar1 != L'\0');
  }
  return format_local;
}

Assistant:

static const wchar_t* ConvertToCLangFormat(
  const wchar_t* format,
  ON_wStringBuffer& clang_format_buffer
  )
{
  size_t format_capacity = 0;
  const wchar_t* s;
  wchar_t c;

  s = format;
  for(;;)
  {
    if ('%' == *s)
    {
      s++;
      c = *s;
      if ('s' == c )
      {
        // convert %s to %ls
        format_capacity++;
        s++;
      }
      else if (c >= '1' && c <= '9')
      {
        // look for %N$s  with N >= 1 ...
        s++;
        while (*s >= '0' && *s <= '9')
          s++;
        if ('$' == *s && 's' == s[1] )
        {
          // convert %N$s to %N$ls
          format_capacity++;
          s++;
          s++;
        }
      }
    }
    if ( 0 == *s++ )
      break;
  }

  if (0 == format_capacity)
    return format;

  format_capacity += (s - format) + 1; // +1 for null terminator

  if ( !clang_format_buffer.GrowBuffer(format_capacity) )
    return format;

  wchar_t* ls = clang_format_buffer.m_buffer; 
  if ( nullptr == ls )
    return format;

  s = format;
  format = ls;
  for(;;)
  {
    if ('%' == *s)
    {
      *ls++ = *s++;
      c = *s;
      if ('s' == c )
      {
        // convert %s to %ls
        *ls++ = 'l';
        *ls++ = *s++;
      }
      else if (c >= '1' && c <= '9')
      {
        // look for %N$s  with N >= 1 ...
        *ls++ = *s++;
        while (*s >= '0' && *s <= '9')
          *ls++ = *s++;
        if ('$' == *s && 's' == s[1] )
        {
          // convert %N$s to %N$ls
          *ls++ = *s++;
          *ls++ = 'l';
          *ls++ = *s++;
        }
      }

    }
    if ( 0 == (*ls++ = *s++) )
      break;
  }

  return format;
}